

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaGrammar::addAnnotation(SchemaGrammar *this,XSAnnotation *annotation)

{
  XSAnnotation *this_00;
  
  this_00 = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::get
                      (this->fAnnotations,this);
  if (this_00 != (XSAnnotation *)0x0) {
    XSAnnotation::setNext(this_00,annotation);
    return;
  }
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::put
            (this->fAnnotations,this,annotation);
  return;
}

Assistant:

void SchemaGrammar::addAnnotation(XSAnnotation* const annotation)
{
    XSAnnotation* lAnnot = fAnnotations->get(this);

    if (lAnnot)
        lAnnot->setNext(annotation);
    else
        fAnnotations->put(this, annotation);
}